

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O0

void player_know_object(player *p,object *obj)

{
  loc_conflict grid;
  _Bool _Var1;
  byte bVar2;
  char cVar3;
  _Bool *p_Var4;
  curse_data *pcVar5;
  char local_78 [8];
  char o_name [80];
  int local_20;
  _Bool known_cursed;
  _Bool known_slay;
  _Bool known_brand;
  _Bool seen;
  wchar_t flag;
  wchar_t i;
  object *obj_local;
  player *p_local;
  
  o_name[0x4f] = '\x01';
  if (((obj != (object *)0x0) && (obj->known != (object *)0x0)) && (obj->kind == obj->known->kind))
  {
    if ((obj->kind == (object_kind *)0x0) || ((obj->known->notice & 2) != 0)) {
      obj->known->dd = obj->dd * p->obj_k->dd;
      obj->known->ds = obj->ds * p->obj_k->ds;
      obj->known->ac = obj->ac * p->obj_k->ac;
      _Var1 = tval_is_chest(obj);
      if (!_Var1) {
        obj->known->pval = obj->pval;
      }
      obj->known->to_a = p->obj_k->to_a * obj->to_a;
      _Var1 = object_has_standard_to_h(obj);
      if (!_Var1) {
        obj->known->to_h = p->obj_k->to_h * obj->to_h;
      }
      obj->known->to_d = p->obj_k->to_d * obj->to_d;
      for (_known_cursed = 0; _known_cursed < 0x11; _known_cursed = _known_cursed + 1) {
        if (p->obj_k->modifiers[_known_cursed] == 0) {
          obj->known->modifiers[_known_cursed] = 0;
        }
        else {
          obj->known->modifiers[_known_cursed] = obj->modifiers[_known_cursed];
        }
      }
      for (_known_cursed = 0; _known_cursed < 0x1c; _known_cursed = _known_cursed + 1) {
        if (p->obj_k->el_info[_known_cursed].res_level == 1) {
          obj->known->el_info[_known_cursed].res_level = obj->el_info[_known_cursed].res_level;
          obj->known->el_info[_known_cursed].flags = obj->el_info[_known_cursed].flags;
        }
        else {
          obj->known->el_info[_known_cursed].res_level = 100;
          obj->known->el_info[_known_cursed].flags = '\0';
        }
      }
      flag_wipe(obj->known->flags,6);
      for (local_20 = flag_next(p->obj_k->flags,6,1); local_20 != 0;
          local_20 = flag_next(p->obj_k->flags,6,local_20 + 1)) {
        _Var1 = flag_has_dbg(obj->flags,6,local_20,"obj->flags","flag");
        if (_Var1) {
          flag_on_dbg(obj->known->flags,6,local_20,"obj->known->flags","flag");
        }
      }
      if (obj->kind != (object_kind *)0x0) {
        if (obj->brands != (_Bool *)0x0) {
          o_name[0x4e] = '\0';
          for (_known_cursed = L'\x01'; _known_cursed < (int)(uint)z_info->brand_max;
              _known_cursed = _known_cursed + L'\x01') {
            _Var1 = player_knows_brand(p,_known_cursed);
            if ((_Var1) && ((obj->brands[_known_cursed] & 1U) != 0)) {
              if (obj->known->brands == (_Bool *)0x0) {
                p_Var4 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
                obj->known->brands = p_Var4;
              }
              obj->known->brands[_known_cursed] = true;
              o_name[0x4e] = '\x01';
            }
            else if (obj->known->brands != (_Bool *)0x0) {
              obj->known->brands[_known_cursed] = false;
            }
          }
          if (((o_name[0x4e] & 1U) == 0) && (obj->known->brands != (_Bool *)0x0)) {
            mem_free(obj->known->brands);
            obj->known->brands = (_Bool *)0x0;
          }
        }
        if (obj->slays != (_Bool *)0x0) {
          o_name[0x4d] = '\0';
          for (_known_cursed = L'\x01'; _known_cursed < (int)(uint)z_info->slay_max;
              _known_cursed = _known_cursed + L'\x01') {
            _Var1 = player_knows_slay(p,_known_cursed);
            if ((_Var1) && ((obj->slays[_known_cursed] & 1U) != 0)) {
              if (obj->known->slays == (_Bool *)0x0) {
                p_Var4 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
                obj->known->slays = p_Var4;
              }
              obj->known->slays[_known_cursed] = true;
              o_name[0x4d] = '\x01';
            }
            else if (obj->known->slays != (_Bool *)0x0) {
              obj->known->slays[_known_cursed] = false;
            }
          }
          if (((o_name[0x4d] & 1U) == 0) && (obj->known->slays != (_Bool *)0x0)) {
            mem_free(obj->known->slays);
            obj->known->slays = (_Bool *)0x0;
          }
        }
        if (obj->curses == (curse_data *)0x0) {
          if (obj->known->curses != (curse_data *)0x0) {
            mem_free(obj->known->curses);
            obj->known->curses = (curse_data *)0x0;
          }
        }
        else {
          o_name[0x4c] = '\0';
          for (_known_cursed = 1; _known_cursed < (int)(uint)z_info->curse_max;
              _known_cursed = _known_cursed + 1) {
            if ((p->obj_k->curses[_known_cursed].power == L'\0') ||
               (obj->curses[_known_cursed].power == L'\0')) {
              if (obj->known->curses != (curse_data *)0x0) {
                obj->known->curses[_known_cursed].power = L'\0';
              }
            }
            else {
              if (obj->known->curses == (curse_data *)0x0) {
                pcVar5 = (curse_data *)mem_zalloc((ulong)z_info->curse_max << 3);
                obj->known->curses = pcVar5;
              }
              obj->known->curses[_known_cursed].power = obj->curses[_known_cursed].power;
              o_name[0x4c] = '\x01';
            }
          }
          if (o_name[0x4c] == '\0') {
            mem_free(obj->known->curses);
            obj->known->curses = (curse_data *)0x0;
          }
        }
        _Var1 = player_knows_ego(p,obj->ego,obj);
        if (_Var1) {
          o_name[0x4f] = obj->ego->everseen & 1;
          obj->known->ego = obj->ego;
        }
        else {
          obj->known->ego = (ego_item *)0x0;
        }
        _Var1 = tval_is_jewelry(obj);
        if (_Var1) {
          _Var1 = object_non_curse_runes_known(obj);
          if (_Var1) {
            if (obj->artifact == (artifact *)0x0) {
              bVar2 = obj->kind->everseen & 1;
            }
            else {
              bVar2 = 1;
            }
            o_name[0x4f] = bVar2 != 0;
            object_flavor_aware(p,obj);
          }
        }
        else if ((uint)z_info->ordinary_kind_max <= obj->kind->kidx) {
          o_name[0x4f] = '\x01';
          object_flavor_aware(p,obj);
        }
        if (((((obj->kind->aware & 1U) != 0) && (obj->kind->flavor != (flavor *)0x0)) ||
            ((_Var1 = tval_is_wearable(obj), !_Var1 && (obj->kind->flavor == (flavor *)0x0)))) ||
           (((_Var1 = tval_is_wearable(obj), _Var1 && (obj->kind->effect != (effect *)0x0)) &&
            ((obj->kind->aware & 1U) != 0)))) {
          obj->known->effect = obj->effect;
        }
        if ((o_name[0x4f] & 1U) == 0) {
          _Var1 = object_is_carried(p,obj);
          if (_Var1) {
            object_desc(local_78,0x50,obj,0x43,p);
            cVar3 = gear_to_label(p,obj);
            msg("You have %s (%c).",local_78,(ulong)(uint)(int)cVar3);
          }
          else if ((cave != (chunk_conflict *)0x0) &&
                  (grid.x = (p->grid).x, grid.y = (p->grid).y,
                  _Var1 = square_holds_object((chunk *)cave,grid,obj), _Var1)) {
            object_desc(local_78,0x50,obj,0x43,p);
            msg("On the ground: %s.",local_78);
          }
        }
        _Var1 = object_fully_known(obj);
        if (_Var1) {
          for (_known_cursed = 0; _known_cursed < 0x1c; _known_cursed = _known_cursed + 1) {
            obj->known->el_info[_known_cursed].res_level = obj->el_info[_known_cursed].res_level;
            obj->known->el_info[_known_cursed].flags = obj->el_info[_known_cursed].flags;
          }
          flag_wipe(obj->known->flags,6);
          flag_copy(obj->known->flags,obj->flags,6);
        }
      }
    }
    else {
      object_set_base_known(p,obj);
    }
  }
  return;
}

Assistant:

void player_know_object(struct player *p, struct object *obj)
{
	int i, flag;
	bool seen = true;

	/* Unseen or only sensed objects don't get any ID */
	if (!obj) return;
	if (!obj->known) return;
	if (obj->kind != obj->known->kind) return;

	/* Distant objects just get base properties */
	if (obj->kind && !(obj->known->notice & OBJ_NOTICE_ASSESSED)) {
		object_set_base_known(p, obj);
		return;
	}

	/* Get the dice, and the pval for anything but chests */
	obj->known->dd = obj->dd * p->obj_k->dd;
	obj->known->ds = obj->ds * p->obj_k->ds;
	obj->known->ac = obj->ac * p->obj_k->ac;
	if (!tval_is_chest(obj))
		obj->known->pval = obj->pval;

	/* Set combat details */
	obj->known->to_a = p->obj_k->to_a * obj->to_a;
	if (!object_has_standard_to_h(obj))
		obj->known->to_h = p->obj_k->to_h * obj->to_h;
	obj->known->to_d = p->obj_k->to_d * obj->to_d;

	/* Set modifiers */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		if (p->obj_k->modifiers[i]) {
			obj->known->modifiers[i] = obj->modifiers[i];
		} else {
			obj->known->modifiers[i] = 0;
		}
	}

	/* Set elements */
	for (i = 0; i < ELEM_MAX; i++) {
		if (p->obj_k->el_info[i].res_level == 1) {
			obj->known->el_info[i].res_level = obj->el_info[i].res_level;
			obj->known->el_info[i].flags = obj->el_info[i].flags;
		} else {
			obj->known->el_info[i].res_level = RES_LEVEL_BASE;
			obj->known->el_info[i].flags = 0;
		}
	}

	/* Set object flags */
	of_wipe(obj->known->flags);
	for (flag = of_next(p->obj_k->flags, FLAG_START); flag != FLAG_END;
		 flag = of_next(p->obj_k->flags, flag + 1)) {
		if (of_has(obj->flags, flag)) {
			of_on(obj->known->flags, flag);
		}
	}

	/* Curse object structures are finished now */
	if (!obj->kind) {
		return;
	}

	/* Set brands */
	if (obj->brands) {
		bool known_brand = false;

		for (i = 1; i < z_info->brand_max; i++) {
			if (player_knows_brand(p, i) && obj->brands[i]) {
				if (!obj->known->brands) {
					obj->known->brands = mem_zalloc(
						z_info->brand_max *
						sizeof(bool));
				}
				obj->known->brands[i] = true;
				known_brand = true;
			} else if (obj->known->brands) {
				obj->known->brands[i] = false;
			}
		}
		if (!known_brand && obj->known->brands) {
			mem_free(obj->known->brands);
			obj->known->brands = NULL;
		}
	}

	/* Set slays */
	if (obj->slays) {
		bool known_slay = false;

		for (i = 1; i < z_info->slay_max; i++) {
			if (player_knows_slay(p, i) && obj->slays[i]) {
				if (!obj->known->slays) {
					obj->known->slays = mem_zalloc(
						z_info->slay_max *
						sizeof(bool));
				}
				obj->known->slays[i] = true;
				known_slay = true;
			} else if (obj->known->slays) {
				obj->known->slays[i] = false;
			}
		}
		if (!known_slay && obj->known->slays) {
			mem_free(obj->known->slays);
			obj->known->slays = NULL;
		}
	}

	/* Set curses - be very careful to keep knowledge aligned */
	if (obj->curses) {
		bool known_cursed = false;
		for (i = 1; i < z_info->curse_max; i++) {
			if (p->obj_k->curses[i].power && obj->curses[i].power) {
				if (!obj->known->curses) {
					obj->known->curses = mem_zalloc(z_info->curse_max *
													sizeof(struct curse_data));
				}
				obj->known->curses[i].power = obj->curses[i].power;
				known_cursed = true;
			} else if (obj->known->curses) {
				obj->known->curses[i].power = 0;
			}
		}
		if (!known_cursed) {
			mem_free(obj->known->curses);
			obj->known->curses = NULL;
		}
	} else if (obj->known->curses) {
		mem_free(obj->known->curses);
		obj->known->curses = NULL;
	}

	/* Set ego type, jewellery type if known */
	if (player_knows_ego(p, obj->ego, obj)) {
		seen = obj->ego->everseen;
		obj->known->ego = obj->ego;
	} else {
		obj->known->ego = NULL;
	}

	if (tval_is_jewelry(obj)) {
		if (object_non_curse_runes_known(obj)) {
			seen = (obj->artifact) ? true : obj->kind->everseen;
			object_flavor_aware(p, obj);
		}
	} else if (obj->kind->kidx >= z_info->ordinary_kind_max) {
		/*
		 * Become aware if it is a special artifact that isn't
		 * jewelry.
		 */
		seen = true;
		object_flavor_aware(p, obj);
	}

	/* Ensure effect is known as if object_set_base_known() had been called. */
	if ((obj->kind->aware && obj->kind->flavor) ||
		(!tval_is_wearable(obj) && !obj->kind->flavor) ||
		(tval_is_wearable(obj) && obj->kind->effect && obj->kind->aware)) {
		obj->known->effect = obj->effect;
	}

	/* Report on new stuff */
	if (!seen) {
		char o_name[80];

		/* Describe the object if it's available */
		if (object_is_carried(p, obj)) {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, p);
			msg("You have %s (%c).", o_name, gear_to_label(p, obj));
		} else if (cave && square_holds_object(cave, p->grid, obj)) {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, p);
			msg("On the ground: %s.", o_name);
		}
	}

	/* Fully known objects have their known element and flag info set to 
	 * match the actual info, rather than showing what elements and flags
	 * the would be displaying if they had them */
	if (object_fully_known(obj)) {
		for (i = 0; i < ELEM_MAX; i++) {
			obj->known->el_info[i].res_level = obj->el_info[i].res_level;
			obj->known->el_info[i].flags = obj->el_info[i].flags;
		}
		of_wipe(obj->known->flags);
		of_copy(obj->known->flags, obj->flags);
	}
}